

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIndexedStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::IndexedStateQueryTests::init
          (IndexedStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  UniformBufferCase *pUVar2;
  
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_0::TransformFeedbackCase::TransformFeedbackCase
            ((TransformFeedbackCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "transform_feedback_buffer_binding","TRANSFORM_FEEDBACK_BUFFER_BINDING");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__ApiCase_00c21a20;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x98);
  anon_unknown_0::TransformFeedbackCase::TransformFeedbackCase
            ((TransformFeedbackCase *)pTVar1,(this->super_TestCaseGroup).m_context,
             "transform_feedback_buffer_start_size",
             "TRANSFORM_FEEDBACK_BUFFER_START and TRANSFORM_FEEDBACK_BUFFER_SIZE");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__ApiCase_00c21af0;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pUVar2 = (UniformBufferCase *)operator_new(0xa0);
  anon_unknown_0::UniformBufferCase::UniformBufferCase
            (pUVar2,(this->super_TestCaseGroup).m_context,"uniform_buffer_binding",
             "UNIFORM_BUFFER_BINDING");
  (pUVar2->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00c21b50;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pUVar2);
  pUVar2 = (UniformBufferCase *)operator_new(0xa0);
  anon_unknown_0::UniformBufferCase::UniformBufferCase
            (pUVar2,(this->super_TestCaseGroup).m_context,"uniform_buffer_start_size",
             "UNIFORM_BUFFER_START and UNIFORM_BUFFER_SIZE");
  (pUVar2->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_00c21c10;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pUVar2);
  return extraout_EAX;
}

Assistant:

void IndexedStateQueryTests::init (void)
{
	// transform feedback
	addChild(new TransformFeedbackBufferBindingCase(m_context, "transform_feedback_buffer_binding", "TRANSFORM_FEEDBACK_BUFFER_BINDING"));
	addChild(new TransformFeedbackBufferBufferCase(m_context, "transform_feedback_buffer_start_size", "TRANSFORM_FEEDBACK_BUFFER_START and TRANSFORM_FEEDBACK_BUFFER_SIZE"));

	// uniform buffers
	addChild(new UniformBufferBindingCase(m_context, "uniform_buffer_binding", "UNIFORM_BUFFER_BINDING"));
	addChild(new UniformBufferBufferCase(m_context, "uniform_buffer_start_size", "UNIFORM_BUFFER_START and UNIFORM_BUFFER_SIZE"));
}